

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalIntergerBinaryExpression
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *leftExpr,
          GCPtr<symbols::Object> *rightExpr)

{
  TokenType TVar1;
  long lVar2;
  long lVar3;
  Object *t;
  string *this_00;
  int iVar4;
  int iVar5;
  bool value;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar2 = __dynamic_cast(leftExpr->addr,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0);
  lVar2 = *(long *)(lVar2 + 0x10);
  lVar3 = __dynamic_cast(rightExpr->addr,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0)
  ;
  lVar3 = *(long *)(lVar3 + 0x10);
  TVar1 = op->Type;
  iVar4 = (int)lVar3;
  iVar5 = (int)lVar2;
  switch(TVar1) {
  case EQ:
    value = lVar2 == lVar3;
    break;
  case NOT_EQ:
    value = lVar2 != lVar3;
    break;
  case GT:
    value = lVar3 < lVar2;
    break;
  case LT:
    value = lVar2 < lVar3;
    break;
  case COMMA:
  case ASSIGN:
  case BANG:
    goto switchD_0010ab76_caseD_108;
  case PLUS:
    t = (Object *)operator_new(0x18);
    iVar5 = iVar4 + iVar5;
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00122b08;
    goto LAB_0010ac99;
  case MINUS:
    t = (Object *)operator_new(0x18);
    iVar5 = iVar5 - iVar4;
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00122b08;
    goto LAB_0010ac99;
  case ASTERISK:
    t = (Object *)operator_new(0x18);
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00122b08;
    iVar5 = iVar5 * iVar4;
LAB_0010ac99:
    t[1]._vptr_Object = (_func_int **)(long)iVar5;
LAB_0010aca3:
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,t);
    return (GCPtr<symbols::Object>)(Object *)this;
  case DIV:
    if (lVar3 != 0) {
      t = (Object *)operator_new(0x18);
      t->_type = INTTYPE;
      t->_vptr_Object = (_func_int **)&PTR_type_00122b08;
      t[1]._vptr_Object = (_func_int **)(long)(int)(lVar2 / lVar3);
      goto LAB_0010aca3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ZeroDivisionError: ",&local_b2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"division by zero",&local_b1);
    newError(this,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
    goto LAB_0010ad20;
  default:
    if (TVar1 == LT_EQ) {
      value = lVar2 <= lVar3;
      break;
    }
    if (TVar1 == GT_EQ) {
      value = lVar3 <= lVar2;
      break;
    }
    goto switchD_0010ab76_caseD_108;
  }
  nativeBooleanObject(this,value);
  return (GCPtr<symbols::Object>)(Object *)this;
switchD_0010ab76_caseD_108:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Unknown Operator: ",&local_b2);
  std::__cxx11::string::string((string *)&local_b0,&op->Literal);
  newError(this,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this_00 = &local_90;
LAB_0010ad20:
  std::__cxx11::string::~string((string *)this_00);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalIntergerBinaryExpression(Token& op, GCPtr<Object>& leftExpr, GCPtr<Object>& rightExpr){
    auto leftValue = dynamic_cast<IntObject*>(leftExpr.raw())->value;
    auto rightValue = dynamic_cast<IntObject*>(rightExpr.raw())->value;
    switch (op.Type) {
     case TokenType::PLUS:
        return new IntObject(leftValue + rightValue);
     case TokenType::MINUS:
        return new IntObject(leftValue - rightValue);
     case TokenType::ASTERISK:
        return new IntObject(leftValue * rightValue);
     case TokenType::DIV:
        {
            if(rightValue == 0)
               return newError("ZeroDivisionError: ",  "division by zero");
            return new IntObject(leftValue / rightValue);
        }
     case TokenType::EQ:
        return nativeBooleanObject(leftValue == rightValue);
     case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue != rightValue);
     case TokenType::LT:
        return nativeBooleanObject(leftValue < rightValue);
     case TokenType::GT:
        return nativeBooleanObject(leftValue > rightValue);
     case TokenType::LT_EQ:
        return nativeBooleanObject(leftValue <= rightValue);
     case TokenType::GT_EQ:
        return nativeBooleanObject(leftValue >= rightValue);
     default:
        return newError("Unknown Operator: ", op.Literal);
    }
}